

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_mipmaps_image *
rf_load_dds_image_to_buffer
          (rf_mipmaps_image *__return_storage_ptr__,void *src,rf_int src_size,void *dst,
          rf_int dst_size)

{
  undefined1 uVar1;
  _Bool _Var2;
  rf_pixel_format rVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  undefined4 *puVar8;
  char *pcVar9;
  void *__src;
  long in_FS_OFFSET;
  rf_dds_header header;
  char local_b0 [12];
  int local_a4;
  int local_a0;
  int local_9c;
  uint local_94;
  uint local_60;
  int local_5c;
  int local_58;
  int local_48;
  
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = 0;
  *(undefined8 *)&__return_storage_ptr__->mipmaps = 0;
  (__return_storage_ptr__->field_0).image.data = (void *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = 0;
  if ((ulong)src_size < 0x80) {
    return __return_storage_ptr__;
  }
  if (src == (void *)0x0) {
    return __return_storage_ptr__;
  }
  if (dst == (void *)0x0) {
    return __return_storage_ptr__;
  }
  if (dst_size < 1) {
    return __return_storage_ptr__;
  }
  puVar8 = (undefined4 *)src;
  pcVar9 = local_b0;
  for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined4 *)pcVar9 = *puVar8;
    puVar8 = puVar8 + 1;
    pcVar9 = pcVar9 + 4;
  }
  _Var2 = rf_match_str_cstr(local_b0,4,"DDS ");
  if (!_Var2) {
    rf_log_impl(8,0x17b636,(char *)0x5);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_load_dds_image_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x454c;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 5;
    return __return_storage_ptr__;
  }
  __src = (void *)((long)src + 0x80);
  lVar4 = src_size + -0x80;
  (__return_storage_ptr__->field_0).image.width = local_a0;
  (__return_storage_ptr__->field_0).image.height = local_a4;
  __return_storage_ptr__->mipmaps = local_94 + (local_94 == 0);
  if (local_58 == 0x10) {
    if (local_60 == 0x41) {
      if (local_48 == 0xf000) {
        sVar6 = (size_t)(local_a4 * local_a0 * 2);
        if (dst_size < (long)sVar6 || lVar4 < (long)sVar6) {
          return __return_storage_ptr__;
        }
        memcpy(dst,__src,sVar6);
        (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R4G4B4A4;
      }
      else {
        if (local_48 != 0x8000) {
          return __return_storage_ptr__;
        }
        sVar6 = (size_t)(local_a4 * local_a0 * 2);
        if (dst_size < (long)sVar6 || lVar4 < (long)sVar6) {
          return __return_storage_ptr__;
        }
        memcpy(dst,__src,sVar6);
        (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R5G5B5A1;
      }
    }
    else {
      if (local_60 != 0x40) {
        return __return_storage_ptr__;
      }
      sVar6 = (size_t)(local_a4 * local_a0 * 2);
      if (dst_size < (long)sVar6 || lVar4 < (long)sVar6) {
        return __return_storage_ptr__;
      }
      memcpy(dst,__src,sVar6);
      (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R5G6B5;
    }
  }
  else if (local_58 == 0x18 && local_60 == 0x40) {
    sVar6 = (size_t)(local_a4 * local_a0 * 3);
    if (dst_size < (long)sVar6 || lVar4 < (long)sVar6) {
      return __return_storage_ptr__;
    }
    memcpy(dst,__src,sVar6);
    (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R8G8B8;
  }
  else if (local_58 == 0x20 && local_60 == 0x41) {
    uVar7 = local_a4 * local_a0 * 4;
    sVar6 = (size_t)(int)uVar7;
    if (dst_size < (long)sVar6 || lVar4 < (long)sVar6) {
      return __return_storage_ptr__;
    }
    memcpy(dst,__src,sVar6);
    if ((local_a4 * local_a0 & 0x3fffffffU) != 0) {
      uVar5 = 0;
      do {
        uVar1 = *(undefined1 *)((long)dst + uVar5);
        *(undefined1 *)((long)dst + uVar5) = *(undefined1 *)((long)dst + uVar5 + 2);
        *(undefined1 *)((long)dst + uVar5 + 2) = uVar1;
        uVar5 = uVar5 + 4;
      } while (uVar5 < uVar7);
    }
    (__return_storage_ptr__->field_0).image.format = RF_UNCOMPRESSED_R8G8B8A8;
  }
  else {
    if (local_5c == 0 || (local_60 & 0xfffffffe) != 4) {
      return __return_storage_ptr__;
    }
    sVar6 = (size_t)(local_9c << (1 < local_94));
    if (dst_size < (long)sVar6 || lVar4 < (long)sVar6) {
      return __return_storage_ptr__;
    }
    memcpy(dst,__src,sVar6);
    if (local_5c == 0x35545844) {
      rVar3 = RF_COMPRESSED_DXT5_RGBA;
    }
    else if (local_5c == 0x33545844) {
      rVar3 = RF_COMPRESSED_DXT3_RGBA;
    }
    else {
      if (local_5c != 0x31545844) goto LAB_0012fac6;
      rVar3 = (local_60 != 4) + RF_COMPRESSED_DXT1_RGB;
    }
    (__return_storage_ptr__->field_0).image.format = rVar3;
  }
LAB_0012fac6:
  (__return_storage_ptr__->field_0).image.data = dst;
  (__return_storage_ptr__->field_0).image.valid = true;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_dds_image_to_buffer(const void* src, rf_int src_size, void* dst, rf_int dst_size)
{
    rf_mipmaps_image result = { 0 };

    if (src && dst && dst_size > 0 && src_size >= sizeof(rf_dds_header))
    {
        rf_dds_header header = *(rf_dds_header*)src;

        src = ((char*)src) + sizeof(rf_dds_header);
        src_size -= sizeof(rf_dds_header);

        // Verify the type of file
        if (rf_match_str_cstr(header.id, sizeof(header.id), "DDS "))
        {
            result.width   = header.width;
            result.height  = header.height;
            result.mipmaps = (header.mipmap_count == 0) ? 1 : header.mipmap_count;

            if (header.ddspf.rgb_bit_count == 16) // 16bit mode, no compressed
            {
                if (header.ddspf.flags == 0x40) // no alpha channel
                {
                    int dds_result_size = header.width * header.height * sizeof(unsigned short);

                    if (src_size >= dds_result_size && dst_size >= dds_result_size)
                    {
                        memcpy(dst, src, dds_result_size);
                        result.format = RF_UNCOMPRESSED_R5G6B5;
                        result.data   = dst;
                        result.valid  = true;
                    }
                }
                else if (header.ddspf.flags == 0x41) // with alpha channel
                {
                    if (header.ddspf.a_bit_mask == 0x8000) // 1bit alpha
                    {
                        int dds_result_size = header.width * header.height * sizeof(unsigned short);

                        if (src_size >= dds_result_size && dst_size >= dds_result_size)
                        {
                            memcpy(dst, src, dds_result_size);

                            unsigned char alpha = 0;

                            // Data comes as A1R5G5B5, it must be reordered to R5G5B5A1
                            for (rf_int i = 0; i < result.width * result.height; i++)
                            {
                                alpha = ((unsigned short *)result.data)[i] >> 15;
                                ((unsigned short*)result.data)[i] = ((unsigned short *)result.data)[i] << 1;
                                ((unsigned short*)result.data)[i] += alpha;
                            }

                            result.format = RF_UNCOMPRESSED_R5G5B5A1;
                            result.data   = dst;
                            result.valid  = true;
                        }
                    }
                    else if (header.ddspf.a_bit_mask == 0xf000) // 4bit alpha
                    {
                        int dds_result_size = header.width * header.height * sizeof(unsigned short);

                        if (src_size >= dds_result_size && dst_size >= dds_result_size)
                        {
                            memcpy(dst, src, dds_result_size);

                            unsigned char alpha = 0;

                            // Data comes as A4R4G4B4, it must be reordered R4G4B4A4
                            for (rf_int i = 0; i < result.width * result.height; i++)
                            {
                                alpha = ((unsigned short*)result.data)[i] >> 12;
                                ((unsigned short*)result.data)[i] = ((unsigned short*)result.data)[i] << 4;
                                ((unsigned short*)result.data)[i] += alpha;
                            }

                            result.format = RF_UNCOMPRESSED_R4G4B4A4;
                            result.data   = dst;
                            result.valid  = true;
                        }
                    }
                }
            }
            else if (header.ddspf.flags == 0x40 && header.ddspf.rgb_bit_count == 24) // DDS_RGB, no compressed, not sure if this case exists...
            {
                int dds_result_size = header.width * header.height * 3;

                if (src_size >= dds_result_size && dst_size >= dds_result_size)
                {
                    memcpy(dst, src, dds_result_size);
                    result.format = RF_UNCOMPRESSED_R8G8B8;
                    result.data   = dst;
                    result.valid  = true;
                }
            }
            else if (header.ddspf.flags == 0x41 && header.ddspf.rgb_bit_count == 32) // DDS_RGBA, no compressed
            {
                int dds_result_size = header.width * header.height * 4;

                if (src_size >= dds_result_size && dst_size >= dds_result_size)
                {
                    memcpy(dst, src, dds_result_size);

                    unsigned char blue = 0;

                    // Data comes as A8R8G8B8, it must be reordered R8G8B8A8 (view next comment)
                    // DirecX understand ARGB as a 32bit DWORD but the actual memory byte alignment is BGRA
                    // So, we must realign B8G8R8A8 to R8G8B8A8
                    for (rf_int i = 0; i < header.width * header.height * 4; i += 4)
                    {
                        blue = ((unsigned char*)dst)[i];
                        ((unsigned char*)dst)[i + 0] = ((unsigned char*)dst)[i + 2];
                        ((unsigned char*)dst)[i + 2] = blue;
                    }

                    result.format = RF_UNCOMPRESSED_R8G8B8A8;
                    result.data   = dst;
                    result.valid  = true;
                }
            }
            else if (((header.ddspf.flags == 0x04) || (header.ddspf.flags == 0x05)) && (header.ddspf.four_cc > 0)) // Compressed
            {
                int dds_result_size = (header.mipmap_count > 1) ? (header.pitch_or_linear_size * 2) : header.pitch_or_linear_size;

                if (src_size >= dds_result_size && dst_size >= dds_result_size)
                {
                    memcpy(dst, src, dds_result_size);

                    switch (header.ddspf.four_cc)
                    {
                        case RF_FOURCC_DXT1: result.format = header.ddspf.flags == 0x04 ? RF_COMPRESSED_DXT1_RGB : RF_COMPRESSED_DXT1_RGBA; break;
                        case RF_FOURCC_DXT3: result.format = RF_COMPRESSED_DXT3_RGBA; break;
                        case RF_FOURCC_DXT5: result.format = RF_COMPRESSED_DXT5_RGBA; break;
                        default: break;
                    }

                    result.data  = dst;
                    result.valid = true;
                }
            }
        }
        else RF_LOG_ERROR(RF_BAD_FORMAT, "DDS file does not seem to be a valid result");
    }

    return result;
}